

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall
AssignmentStatement::AssignmentStatement(AssignmentStatement *this,string *lhsVar,ExprNode *rhsExpr)

{
  ExprNode *rhsExpr_local;
  string *lhsVar_local;
  AssignmentStatement *this_local;
  
  Function::Function(&this->super_Function);
  Functions::Functions(&this->super_Functions);
  (this->super_Function).super_Statement._vptr_Statement = (_func_int **)&PTR_print_00131b78;
  std::__cxx11::string::string((string *)&this->_lhsVariable,(string *)lhsVar);
  this->_rhsExpression = rhsExpr;
  this->_testlist = (Testlist *)0x0;
  this->_subscription = (ExprNode *)0x0;
  std::vector<Statement_*,_std::allocator<Statement_*>_>::vector(&this->_functionStack);
  return;
}

Assistant:

AssignmentStatement::AssignmentStatement(std::string lhsVar, ExprNode *rhsExpr):
        _lhsVariable{lhsVar}, _rhsExpression{rhsExpr},_testlist{nullptr},_subscription{nullptr} {}